

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

int checkCharRefNumber(int result)

{
  int iVar1;
  
  iVar1 = result >> 8;
  if (7 < iVar1 - 0xd8U) {
    if (iVar1 == 0xff) {
      if ((result & 0xfffffffeU) != 0xfffe) {
        return result;
      }
    }
    else if ((iVar1 != 0) || (latin1_encoding.type[result] != '\0')) {
      return result;
    }
  }
  return -1;
}

Assistant:

static
int checkCharRefNumber(int result)
{
  switch (result >> 8) {
  case 0xD8: case 0xD9: case 0xDA: case 0xDB:
  case 0xDC: case 0xDD: case 0xDE: case 0xDF:
    return -1;
  case 0:
    if (latin1_encoding.type[result] == BT_NONXML)
      return -1;
    break;
  case 0xFF:
    if (result == 0xFFFE || result == 0xFFFF)
      return -1;
    break;
  }
  return result;
}